

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

int Wln_NtkIsAcyclic(Wln_Ntk_t *p)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  FILE *pFVar11;
  
  iVar9 = p->nTravIds;
  iVar1 = iVar9 + 1;
  p->nTravIds = iVar1;
  if (iVar9 == 0) {
    uVar7 = (p->vTypes).nCap;
    if ((p->vTravIds).nCap < (int)uVar7) {
      piVar2 = (p->vTravIds).pArray;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc((long)(int)uVar7 << 2);
      }
      else {
        piVar2 = (int *)realloc(piVar2,(long)(int)uVar7 << 2);
      }
      (p->vTravIds).pArray = piVar2;
      if (piVar2 == (int *)0x0) goto LAB_00385d4a;
      (p->vTravIds).nCap = uVar7;
    }
    if (0 < (int)uVar7) {
      memset((p->vTravIds).pArray,0,(ulong)uVar7 * 4);
    }
    (p->vTravIds).nSize = uVar7;
    iVar1 = p->nTravIds;
  }
  p->nTravIds = iVar1 + 1;
  if (iVar1 == 0) {
    uVar7 = (p->vTypes).nCap;
    if ((p->vTravIds).nCap < (int)uVar7) {
      piVar2 = (p->vTravIds).pArray;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc((long)(int)uVar7 << 2);
      }
      else {
        piVar2 = (int *)realloc(piVar2,(long)(int)uVar7 << 2);
      }
      (p->vTravIds).pArray = piVar2;
      if (piVar2 == (int *)0x0) {
LAB_00385d4a:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vTravIds).nCap = uVar7;
    }
    if (0 < (int)uVar7) {
      memset((p->vTravIds).pArray,0,(ulong)uVar7 * 4);
    }
    (p->vTravIds).nSize = uVar7;
  }
  if (0 < (p->vCos).nSize) {
    lVar10 = 0;
    do {
      uVar7 = (p->vCos).pArray[lVar10];
      iVar1 = Wln_NtkIsAcyclic_rec(p,uVar7);
      pFVar11 = _stdout;
      if (iVar1 == 0) {
        pcVar3 = Wln_ObjName(p,uVar7);
        pcVar4 = "Primary output %16s (ID %6d)\n";
        goto LAB_00385cd0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vCos).nSize);
  }
  if (0 < (p->vFfs).nSize) {
    lVar10 = 0;
    do {
      uVar7 = (p->vFfs).pArray[lVar10];
      iVar1 = Wln_NtkIsAcyclic_rec(p,uVar7);
      pFVar11 = _stdout;
      if (iVar1 == 0) {
        pcVar3 = Wln_ObjName(p,uVar7);
        pcVar4 = "Flip-flop %16s (ID %6d)\n";
LAB_00385cd0:
        fprintf(pFVar11,pcVar4,pcVar3,(ulong)uVar7);
        return 0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vFfs).nSize);
  }
  iVar1 = (p->vTypes).nSize;
  if (1 < (long)iVar1) {
    iVar9 = (p->vTravIds).nSize;
    iVar5 = 1;
    if (1 < iVar9) {
      iVar5 = iVar9;
    }
    if (iVar5 - 1U <= iVar1 - 2U) {
LAB_00385d2b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar7 = 0;
    lVar10 = 1;
    do {
      uVar6 = 0;
      if ((p->vTravIds).pArray[lVar10] != p->nTravIds + -1) {
        uVar6 = (uint)((p->vTypes).pArray[lVar10] != 3);
      }
      uVar7 = uVar7 + uVar6;
      lVar10 = lVar10 + 1;
    } while (iVar1 != lVar10);
    if (uVar7 != 0) {
      Wln_NtkCreateRefs(p);
      uVar6 = (p->vTypes).nSize;
      printf("The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n"
             ,((double)(int)uVar7 * 100.0) / (double)(int)uVar6,(ulong)uVar6,(ulong)uVar7);
      iVar1 = (p->vTypes).nSize;
      if (1 < (long)iVar1) {
        iVar9 = (p->vRefs).nSize;
        iVar5 = 1;
        if (1 < iVar9) {
          iVar5 = iVar9;
        }
        if (iVar5 - 1U <= iVar1 - 2U) goto LAB_00385d2b;
        uVar7 = 0;
        lVar10 = 1;
        do {
          if (((p->vRefs).pArray[lVar10] == 0) &&
             (iVar9 = (p->vTypes).pArray[lVar10], 1 < iVar9 - 3U)) {
            uVar7 = uVar7 + (iVar9 != 0x59);
          }
          lVar10 = lVar10 + 1;
        } while (iVar1 != lVar10);
        if (uVar7 != 0) {
          iVar9 = 0;
          printf("These unconnected objects feed into %d sink objects without fanout:\n",
                 (ulong)uVar7);
          iVar1 = (p->vTypes).nSize;
          if (1 < iVar1) {
            uVar8 = 1;
            iVar9 = 0;
            do {
              pFVar11 = _stdout;
              if ((long)(p->vRefs).nSize <= (long)uVar8) goto LAB_00385d2b;
              if ((((p->vRefs).pArray[uVar8] == 0) &&
                  (iVar5 = (p->vTypes).pArray[uVar8], 1 < iVar5 - 3U)) && (iVar5 != 0x59)) {
                pcVar3 = Wln_ObjName(p,(int)uVar8);
                if (((long)(p->vTypes).nSize <= (long)uVar8) ||
                   (pcVar4 = Abc_OperName((p->vTypes).pArray[uVar8]),
                   (long)(p->vTypes).nSize <= (long)uVar8)) goto LAB_00385d2b;
                fprintf(pFVar11,"Node %16s (ID %6d) of type %5s (type ID %2d)\n",pcVar3,
                        uVar8 & 0xffffffff,pcVar4,(ulong)(uint)(p->vTypes).pArray[uVar8]);
                iVar9 = iVar9 + 1;
                if (iVar9 == 5) {
                  iVar9 = 5;
                  break;
                }
                iVar1 = (p->vTypes).nSize;
              }
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < (long)iVar1);
          }
          if (iVar9 < (int)uVar7) {
            puts("...");
          }
        }
        iVar1 = (p->vTypes).nSize;
        if (1 < iVar1) {
          lVar10 = 1;
          do {
            if ((p->vTravIds).nSize <= lVar10) goto LAB_00385d2b;
            if (((p->vTravIds).pArray[lVar10] != p->nTravIds + -1) &&
               ((p->vTypes).pArray[lVar10] != 3)) {
              iVar1 = Wln_NtkIsAcyclic_rec(p,(int)lVar10);
              pFVar11 = _stdout;
              if (iVar1 == 0) {
                pcVar3 = Wln_ObjName(p,(int)lVar10);
                fprintf(pFVar11,"Unconnected object %s\n",pcVar3);
                return 0;
              }
              iVar1 = (p->vTypes).nSize;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar1);
        }
      }
    }
  }
  return 1;
}

Assistant:

int Wln_NtkIsAcyclic( Wln_Ntk_t * p )
{
    int fAcyclic, i, iObj, nUnvisited = 0 ;
    // set the traversal ID for this DFS ordering
    Wln_NtkIncrementTravId( p );   
    Wln_NtkIncrementTravId( p );   
    // iObj->TravId == pNet->nTravIds      means "iObj is on the path"
    // iObj->TravId == pNet->nTravIds - 1  means "iObj is visited but is not on the path"
    // iObj->TravId <  pNet->nTravIds - 1  means "iObj is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Wln_NtkForEachCo( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Primary output %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachFf( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Flip-flop %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachObj( p, iObj )
        nUnvisited += !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj);
    if ( nUnvisited )
    {
        int nSinks = 0;
        Wln_NtkCreateRefs(p);
        printf( "The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n", 
            Wln_NtkObjNum(p), nUnvisited, 100.0*nUnvisited/Wln_NtkObjNum(p) );
        Wln_NtkForEachObj( p, iObj )
            if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                nSinks++;
        if ( nSinks )
        {
            int nPrinted = 0;
            printf( "These unconnected objects feed into %d sink objects without fanout:\n", nSinks );
            Wln_NtkForEachObj( p, iObj )
                if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                {
                    fprintf( stdout, "Node %16s (ID %6d) of type %5s (type ID %2d)\n", 
                        Wln_ObjName(p, iObj), iObj, Abc_OperName(Wln_ObjType(p, iObj)), Wln_ObjType(p, iObj) );
                    if ( ++nPrinted == 5 )
                        break;
                }
            if ( nPrinted < nSinks )
                printf( "...\n" );
        }
        Wln_NtkForEachObj( p, iObj )
            if ( /*!Wln_ObjRefs(p, iObj) &&*/ !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj) )
            {
                // traverse the output logic cone
                if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
                    continue;
                // stop as soon as the first loop is detected
                fprintf( stdout, "Unconnected object %s\n", Wln_ObjName(p, iObj) );
                goto finish;
            }
    }
finish:
    return fAcyclic;
}